

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagelayout.cpp
# Opt level: O2

bool __thiscall
QPageLayout::setRightMargin(QPageLayout *this,qreal rightMargin,OutOfBoundsPolicy outOfBoundsPolicy)

{
  double dVar1;
  QPageLayoutPrivate *pQVar2;
  bool bVar3;
  bool bVar4;
  double dVar5;
  
  pQVar2 = (this->d).d.ptr;
  if ((outOfBoundsPolicy == Clamp) && (pQVar2->m_mode == StandardMode)) {
    dVar5 = (pQVar2->m_maxMargins).m_right;
    if (rightMargin <= dVar5) {
      dVar5 = rightMargin;
    }
    dVar1 = (pQVar2->m_minMargins).m_right;
    rightMargin = dVar5;
    if (dVar5 <= dVar1) {
      rightMargin = dVar1;
    }
  }
  bVar3 = qFuzzyCompare(rightMargin,(pQVar2->m_margins).m_right);
  bVar4 = true;
  if (!bVar3) {
    pQVar2 = (this->d).d.ptr;
    if ((pQVar2->m_mode == FullPageMode) ||
       (((pQVar2->m_minMargins).m_right <= rightMargin &&
        (rightMargin <= (pQVar2->m_maxMargins).m_right)))) {
      QExplicitlySharedDataPointer<QPageLayoutPrivate>::detach(&this->d);
      (((this->d).d.ptr)->m_margins).m_right = rightMargin;
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool QPageLayout::setRightMargin(qreal rightMargin, OutOfBoundsPolicy outOfBoundsPolicy)
{
    if (d->m_mode == StandardMode && outOfBoundsPolicy == OutOfBoundsPolicy::Clamp)
        rightMargin = qBound(d->m_minMargins.right(), rightMargin, d->m_maxMargins.right());

    if (qFuzzyCompare(rightMargin, d->m_margins.right()))
        return true;

    if (d->m_mode == FullPageMode
        || (rightMargin >= d->m_minMargins.right() && rightMargin <= d->m_maxMargins.right())) {
        d.detach();
        d->m_margins.setRight(rightMargin);
        return true;
    }

    return false;
}